

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# easylogging++.cc
# Opt level: O3

void el::Configurations::Parser::ignoreComments(string *line)

{
  long lVar1;
  ulong uVar2;
  char *pcVar3;
  ulong uVar4;
  long *plStack_70;
  string *psStack_68;
  long alStack_60 [2];
  string *psStack_50;
  undefined8 uStack_48;
  code *pcStack_40;
  long *local_38 [2];
  long local_28 [2];
  
  pcStack_40 = (code *)0x13670f;
  lVar1 = std::__cxx11::string::find((char *)line,0x1a6169,0);
  uVar4 = 0xffffffffffffffff;
  if (lVar1 != -1) {
    pcStack_40 = (code *)0x136736;
    for (uVar2 = std::__cxx11::string::find((char *)line,0x1a6169,lVar1 + 1);
        uVar4 = 0xffffffffffffffff, uVar2 != 0xffffffffffffffff;
        uVar2 = std::__cxx11::string::find((char *)line,0x1a6169,uVar2 + 2)) {
      if (line->_M_string_length <= uVar2 - 1) {
        pcVar3 = "basic_string::at: __n (which is %zu) >= this->size() (which is %zu)";
        pcStack_40 = isLevel;
        std::__throw_out_of_range_fmt
                  ("basic_string::at: __n (which is %zu) >= this->size() (which is %zu)");
        pcStack_40 = (code *)0x1a6169;
        uStack_48 = 0xffffffffffffffff;
        plStack_70 = alStack_60;
        psStack_50 = line;
        std::__cxx11::string::_M_construct<char_const*>((string *)&plStack_70,"*","");
        if (psStack_68 <= *(string **)(pcVar3 + 8)) {
          std::__cxx11::string::compare((ulong)pcVar3,0,psStack_68);
        }
        if (plStack_70 != alStack_60) {
          operator_delete(plStack_70,alStack_60[0] + 1);
        }
        return;
      }
      uVar4 = uVar2;
      if ((line->_M_dataplus)._M_p[uVar2 - 1] != '\\') break;
      pcStack_40 = (code *)0x136774;
    }
  }
  pcStack_40 = (code *)0x136795;
  uVar2 = std::__cxx11::string::find((char *)line,0x1bbdb9,0);
  if (uVar2 != 0xffffffffffffffff) {
    if (uVar2 < uVar4) {
      pcStack_40 = (code *)0x1367ba;
      std::__cxx11::string::find((char *)line,0x1bbdb9,uVar4 + 1);
    }
    pcStack_40 = (code *)0x1367cd;
    std::__cxx11::string::substr((ulong)local_38,(ulong)line);
    pcStack_40 = (code *)0x1367d8;
    std::__cxx11::string::operator=((string *)line,(string *)local_38);
    if (local_38[0] != local_28) {
      pcStack_40 = (code *)0x1367f2;
      operator_delete(local_38[0],local_28[0] + 1);
    }
  }
  return;
}

Assistant:

void Configurations::Parser::ignoreComments(std::string* line) {
  std::size_t foundAt = 0;
  std::size_t quotesStart = line->find("\"");
  std::size_t quotesEnd = std::string::npos;
  if (quotesStart != std::string::npos) {
    quotesEnd = line->find("\"", quotesStart + 1);
    while (quotesEnd != std::string::npos && line->at(quotesEnd - 1) == '\\') {
      // Do not erase slash yet - we will erase it in parseLine(..) while loop
      quotesEnd = line->find("\"", quotesEnd + 2);
    }
  }
  if ((foundAt = line->find(base::consts::kConfigurationComment)) != std::string::npos) {
    if (foundAt < quotesEnd) {
      foundAt = line->find(base::consts::kConfigurationComment, quotesEnd + 1);
    }
    *line = line->substr(0, foundAt);
  }
}